

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANTLRException.hpp
# Opt level: O2

void __thiscall antlr::ANTLRException::ANTLRException(ANTLRException *this,ANTLRException *param_1)

{
  this->_vptr_ANTLRException = (_func_int **)&PTR__ANTLRException_002041e8;
  std::__cxx11::string::string((string *)&this->text,(string *)&param_1->text);
  return;
}

Assistant:

class ANTLR_API ANTLRException
{
public:
	/// Create ANTLR base exception without error message
	ANTLRException() : text("")
	{
	}
	/// Create ANTLR base exception with error message
	ANTLRException(const ANTLR_USE_NAMESPACE(std)string& s)
	: text(s)
	{
	}
	virtual ~ANTLRException() throw()
	{
	}

	/** Return complete error message with line/column number info (if present)
	 * @note for your own exceptions override this one. Call getMessage from
	 * here to get the 'clean' error message stored in the text attribute.
	 */
	virtual ANTLR_USE_NAMESPACE(std)string toString() const
	{
		return text;
	}

	/** Return error message without additional info (if present)
	 * @note when making your own exceptions classes override toString
	 * and call in toString getMessage which relays the text attribute
	 * from here.
	 */
	virtual ANTLR_USE_NAMESPACE(std)string getMessage() const
	{
		return text;
	}
private:
	ANTLR_USE_NAMESPACE(std)string text;
}